

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O1

int isNonTemporalSubformula(ltlNode *topNode)

{
  int iVar1;
  
  do {
    switch(topNode->type) {
    case AND:
    case OR:
    case IMPLY:
      iVar1 = isNonTemporalSubformula(topNode->left);
      if (iVar1 == 0) {
        return 0;
      }
      topNode = topNode->right;
      break;
    case NOT:
      if (topNode->right != (ltlNode_t *)0x0) {
        __assert_fail("topNode->right == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/ltl_parser.c"
                      ,0x28c,"int isNonTemporalSubformula(ltlNode *)");
      }
      topNode = topNode->left;
      break;
    default:
      return 0;
    case BOOL:
      return 1;
    }
  } while( true );
}

Assistant:

int isNonTemporalSubformula( ltlNode *topNode )
{
    switch( topNode->type ){
        case AND:
        case OR:
        case IMPLY:
            return isNonTemporalSubformula( topNode->left) && isNonTemporalSubformula( topNode->right ) ;
        case NOT:
            assert( topNode->right == NULL );
            return isNonTemporalSubformula( topNode->left );
        case BOOL:
            return 1;
        default:
            return 0;
    }
}